

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O1

uchar * google::CheckNotNull<unsigned_char*>(char *file,int line,char *names,uchar **t)

{
  string *this;
  allocator<char> local_41;
  CheckOpString local_40;
  LogMessageFatal local_38;
  
  if (*t != (uchar *)0x0) {
    return *t;
  }
  if (g_new_hook != (code *)0x0) {
    (*g_new_hook)();
  }
  this = (string *)malloc(0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)this,names,&local_41);
  local_40.str_ = this;
  LogMessageFatal::LogMessageFatal(&local_38,file,line,&local_40);
  LogMessageFatal::~LogMessageFatal(&local_38);
}

Assistant:

T CheckNotNull(const char* file, int line, const char* names, T&& t) {
 if (t == nullptr) {
   LogMessageFatal(file, line, new std::string(names));
 }
 return std::forward<T>(t);
}